

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O0

CornerData<Vector2> *
geometrycentral::surface::packToParam(SurfaceMesh *mesh,VertexData<double> *vals)

{
  Vertex e;
  Corner e_00;
  bool bVar1;
  double *pdVar2;
  CornerData<Vector2> *in_RDI;
  _List_node_base _Var3;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> EVar4;
  Vertex v;
  Corner c;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __begin2;
  CornerSet *__range2;
  CornerData<Vector2> *out;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> *in_stack_fffffffffffffed8;
  SurfaceMesh *in_stack_fffffffffffffee0;
  ParentMeshT *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  ParentMeshT *local_b0;
  _List_node_base *local_a8;
  ParentMeshT *local_a0;
  size_t sStack_98;
  ParentMeshT *local_90;
  _List_node_base *p_Stack_88;
  _List_node_base *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::MeshData
            ((MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2> *)
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
            );
  SurfaceMesh::corners(in_stack_fffffffffffffee0);
  local_28 = (_List_node_base *)&stack0xffffffffffffffc0;
  RangeSetBase<geometrycentral::surface::CornerRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::CornerRangeF> *)in_stack_fffffffffffffee0);
  RangeSetBase<geometrycentral::surface::CornerRangeF>::end
            ((RangeSetBase<geometrycentral::surface::CornerRangeF> *)in_stack_fffffffffffffee0);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
                       in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (!bVar1) break;
    _Var3 = (_List_node_base)
            RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator*
                      ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)0x20e0dd);
    _local_90 = _Var3;
    EVar4 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
            Corner::vertex((Corner *)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffee0 = (SurfaceMesh *)&stack0xffffffffffffff50;
    e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)_Var3._M_prev;
    e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         EVar4.mesh;
    _local_a0 = EVar4;
    pdVar2 = MeshData<geometrycentral::surface::Vertex,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Vertex,_double> *)EVar4.ind,e);
    in_stack_fffffffffffffee0->_vptr_SurfaceMesh = (_func_int **)*pdVar2;
    local_a8 = (_List_node_base *)0x0;
    e_00.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.ind
         = (size_t)_Var3._M_prev;
    e_00.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.mesh
         = EVar4.mesh;
    in_stack_fffffffffffffed8 =
         (RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
         MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::operator[]
                   ((MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2> *)
                    EVar4.ind,e_00);
    in_stack_fffffffffffffed8->mesh = local_b0;
    in_stack_fffffffffffffed8->iCurr = (size_t)local_a8;
    RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
               in_stack_fffffffffffffee0);
  }
  return in_RDI;
}

Assistant:

CornerData<Vector2> packToParam(SurfaceMesh& mesh, VertexData<double>& vals) {
  CornerData<Vector2> out(mesh);
  for (Corner c : mesh.corners()) {
    Vertex v = c.vertex();
    out[c] = Vector2{vals[v], 0.};
  }
  return out;
}